

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<chaiscript::Boxed_Value>::operator()<>
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value> *this)

{
  Boxed_Value *pBVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Function_Params *in_RSI;
  Boxed_Value BVar3;
  Type_Conversions_State state_1;
  Type_Conversions_State state;
  Type_Conversions_State local_e8;
  Type_Conversions_State local_d8;
  pthread_rwlock_t local_c8;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  pBVar1 = in_RSI[1].m_end;
  if (pBVar1 == (Boxed_Value *)0x0) {
    local_78 = &local_88;
    local_88 = 0;
    uStack_80 = 0;
    local_c8._48_8_ = 0;
    uStack_90 = 0;
    local_c8._32_8_ = 0;
    local_c8.__data.__pad2 = 0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_c8.__align = 0;
    local_c8._8_8_ = 0;
    local_48 = &local_58;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_70 = local_78;
    local_40 = local_48;
    local_e8.m_saves._M_data =
         chaiscript::detail::threading::
         Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*(&local_20);
    local_e8.m_conversions._M_data = (Type_Conversions *)&local_c8;
    local_d8.m_conversions._M_data = (Type_Conversions *)0x0;
    local_d8.m_saves._M_data = (Conversion_Saves *)0x0;
    call(this,in_RSI,&local_d8);
    Type_Conversions::~Type_Conversions((Type_Conversions *)&local_c8.__data);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    local_c8._8_8_ =
         chaiscript::detail::threading::
         Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*
                   ((Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> *)
                    &pBVar1[10].m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
    local_e8.m_conversions._M_data = (Type_Conversions *)0x0;
    local_e8.m_saves._M_data = (Conversion_Saves *)0x0;
    local_c8.__align = (long)pBVar1;
    BVar3 = call(this,in_RSI,&local_e8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }